

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O0

ion_err_t ion_fseek(ion_file_handle_t file,ion_file_offset_t seek_to,int origin)

{
  int iVar1;
  int origin_local;
  ion_file_offset_t seek_to_local;
  ion_file_handle_t file_local;
  
  iVar1 = fseek((FILE *)file,seek_to,origin);
  if (iVar1 == 0) {
    file_local._7_1_ = '\0';
  }
  else {
    file_local._7_1_ = '\r';
  }
  return file_local._7_1_;
}

Assistant:

ion_err_t
ion_fseek(
	ion_file_handle_t	file,
	ion_file_offset_t	seek_to,
	int					origin
) {
#if defined(ARDUINO)

	if (0 != fseek(file.file, seek_to, origin)) {
		return err_file_bad_seek;
	}

	return err_ok;
#else

	if (0 != fseek(file, seek_to, origin)) {
		return err_file_bad_seek;
	}

	return err_ok;
#endif
}